

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O1

void __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::terminate_all_workers
          (pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
           *this,bool wait)

{
  pointer psVar1;
  recursive_mutex *__mutex;
  int iVar2;
  undefined7 in_register_00000031;
  pointer psVar3;
  pointer psVar4;
  scoped_lock lock;
  unique_lock<boost::recursive_mutex> local_38;
  
  local_38.m = &this->m_monitor;
  local_38.is_locked = false;
  unique_lock<boost::recursive_mutex>::lock(&local_38);
  this->m_terminate_all_workers = true;
  this->m_target_worker_count = 0;
  condition_variable_any::notify_all(&this->m_task_or_terminate_workers_event);
  if ((int)CONCAT71(in_register_00000031,wait) != 0) {
    while (this->m_active_worker_count != 0) {
      condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                (&this->m_worker_idle_or_terminated_event,&local_38);
    }
    for (psVar4 = (this->m_terminated_workers).
                  super__Vector_base<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_std::allocator<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (this->m_terminated_workers).
                 super__Vector_base<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_std::allocator<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
      ::join(psVar4->px);
    }
    psVar4 = (this->m_terminated_workers).
             super__Vector_base<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_std::allocator<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = psVar4;
    if (psVar1 != psVar4) {
      do {
        boost::detail::shared_count::~shared_count(&psVar3->pn);
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar1);
      (this->m_terminated_workers).
      super__Vector_base<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_std::allocator<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar4;
    }
  }
  __mutex = local_38.m;
  if (local_38.is_locked == true) {
    do {
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    } while (iVar2 == 4);
  }
  return;
}

Assistant:

void terminate_all_workers(bool const wait) volatile
    {
      pool_type* self = const_cast<pool_type*>(this);
      recursive_mutex::scoped_lock lock(self->m_monitor);

      self->m_terminate_all_workers = true;

      m_target_worker_count = 0;
      self->m_task_or_terminate_workers_event.notify_all();

      if(wait)
      {
        while(m_active_worker_count > 0)
        {
          self->m_worker_idle_or_terminated_event.wait(lock);
        }

        for(typename std::vector<shared_ptr<worker_type> >::iterator it = self->m_terminated_workers.begin();
          it != self->m_terminated_workers.end();
          ++it)
        {
          (*it)->join();
        }
        self->m_terminated_workers.clear();
      }
    }